

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_test.cc
# Opt level: O0

void * worker(void *voidargs)

{
  int8_t delta_8;
  int16_t delta_16;
  int32_t delta_32;
  int64_t delta_64;
  int i;
  worker_args *args;
  undefined1 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined1 uVar4;
  int8_t increment;
  atomic<unsigned_long> *atomic_val;
  undefined4 local_14;
  
  atomic_val = (atomic<unsigned_long> *)0xa;
  uVar3 = 5;
  uVar4 = 0;
  increment = '\0';
  uVar2 = 3;
  uVar1 = 1;
  for (local_14 = 0; local_14 < 10000; local_14 = local_14 + 1) {
    atomic_incr_uint64_t(atomic_val,CONCAT13(increment,CONCAT12(uVar4,uVar3)));
    atomic_decr_uint64_t(atomic_val,CONCAT13(increment,CONCAT12(uVar4,uVar3)));
    atomic_add_uint64_t(atomic_val,
                        CONCAT17(increment,
                                 CONCAT16(uVar4,CONCAT24(uVar3,CONCAT22(uVar2,CONCAT11(uVar1,
                                                  in_stack_ffffffffffffffd8))))),
                        memory_order_relaxed);
    atomic_sub_uint64_t(atomic_val,
                        CONCAT17(increment,
                                 CONCAT16(uVar4,CONCAT24(uVar3,CONCAT22(uVar2,CONCAT11(uVar1,
                                                  in_stack_ffffffffffffffd8))))),
                        memory_order_relaxed);
    atomic_incr_uint32_t
              ((atomic<unsigned_int> *)atomic_val,CONCAT13(increment,CONCAT12(uVar4,uVar3)));
    atomic_decr_uint32_t
              ((atomic<unsigned_int> *)atomic_val,CONCAT13(increment,CONCAT12(uVar4,uVar3)));
    atomic_add_uint32_t((atomic<unsigned_int> *)atomic_val,CONCAT13(increment,CONCAT12(uVar4,uVar3))
                        ,CONCAT22(uVar2,CONCAT11(uVar1,in_stack_ffffffffffffffd8)));
    atomic_sub_uint32_t((atomic<unsigned_int> *)atomic_val,CONCAT13(increment,CONCAT12(uVar4,uVar3))
                        ,CONCAT22(uVar2,CONCAT11(uVar1,in_stack_ffffffffffffffd8)));
    atomic_incr_uint16_t
              ((atomic<unsigned_short> *)atomic_val,CONCAT13(increment,CONCAT12(uVar4,uVar3)));
    atomic_decr_uint16_t
              ((atomic<unsigned_short> *)atomic_val,CONCAT13(increment,CONCAT12(uVar4,uVar3)));
    atomic_add_uint16_t((atomic<unsigned_short> *)atomic_val,CONCAT11(increment,uVar4),
                        CONCAT22(uVar2,CONCAT11(uVar1,in_stack_ffffffffffffffd8)));
    atomic_sub_uint16_t((atomic<unsigned_short> *)atomic_val,CONCAT11(increment,uVar4),
                        CONCAT22(uVar2,CONCAT11(uVar1,in_stack_ffffffffffffffd8)));
    atomic_incr_uint8_t((atomic<unsigned_char> *)atomic_val,
                        CONCAT13(increment,CONCAT12(uVar4,uVar3)));
    atomic_decr_uint8_t((atomic<unsigned_char> *)atomic_val,
                        CONCAT13(increment,CONCAT12(uVar4,uVar3)));
    atomic_add_uint8_t((atomic<unsigned_char> *)atomic_val,increment,
                       CONCAT22(uVar2,CONCAT11(uVar1,in_stack_ffffffffffffffd8)));
    atomic_sub_uint8_t((atomic<unsigned_char> *)atomic_val,increment,
                       CONCAT22(uVar2,CONCAT11(uVar1,in_stack_ffffffffffffffd8)));
  }
  pthread_exit((void *)0x0);
}

Assistant:

void * worker(void *voidargs)
{
    struct worker_args *args = (struct worker_args*)voidargs;
    int i = 0;
    int64_t delta_64 = 10;
    int32_t delta_32 = 5;
    int16_t delta_16 = 3;
    int8_t delta_8 = 1;

    for (; i < 10000; ++i) {
        atomic_incr_uint64_t(args->counter_64);
        atomic_decr_uint64_t(args->counter_64);
        atomic_add_uint64_t(args->counter_64, delta_64);
        atomic_sub_uint64_t(args->counter_64, delta_64);

        atomic_incr_uint32_t(args->counter_32);
        atomic_decr_uint32_t(args->counter_32);
        atomic_add_uint32_t(args->counter_32, delta_32);
        atomic_sub_uint32_t(args->counter_32, delta_32);

        atomic_incr_uint16_t(args->counter_16);
        atomic_decr_uint16_t(args->counter_16);
        atomic_add_uint16_t(args->counter_16, delta_16);
        atomic_sub_uint16_t(args->counter_16, delta_16);

        atomic_incr_uint8_t(args->counter_8);
        atomic_decr_uint8_t(args->counter_8);
        atomic_add_uint8_t(args->counter_8, delta_8);
        atomic_sub_uint8_t(args->counter_8, delta_8);
    }

    thread_exit(0);
    return NULL;
}